

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<long,_4UL,_0UL,_std::allocator<long>_>::small_vector
          (small_vector<long,_4UL,_0UL,_std::allocator<long>_> *this,
          small_vector<long,_4UL,_0UL,_std::allocator<long>_> *v,allocator<long> *alloc)

{
  size_t sVar1;
  long *plVar2;
  small_vector<long,_4UL,_0UL,_std::allocator<long>_> *in_RSI;
  small_vector<long,_4UL,_0UL,_std::allocator<long>_> *in_RDI;
  pointer p;
  allocator<long> *in_stack_ffffffffffffffb8;
  allocator<long> *in_stack_ffffffffffffffc0;
  pointer local_30;
  
  std::allocator<long>::allocator(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  in_RDI->m_dynamic_capacity = 0;
  in_RDI->m_dynamic_data = (pointer)0x0;
  sVar1 = size(in_RSI);
  if (sVar1 < 5) {
    plVar2 = static_begin_ptr(in_RDI);
    in_RDI->m_end = plVar2;
    in_RDI->m_begin = plVar2;
    in_RDI->m_capacity = 4;
  }
  else {
    sVar1 = size(in_RSI);
    in_RDI->m_dynamic_capacity = sVar1;
    get_alloc(in_RDI);
    in_stack_ffffffffffffffc0 =
         (allocator<long> *)
         std::allocator_traits<std::allocator<long>_>::allocate
                   (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    in_RDI->m_dynamic_data = (pointer)in_stack_ffffffffffffffc0;
    in_RDI->m_end = (pointer)in_stack_ffffffffffffffc0;
    in_RDI->m_begin = (pointer)in_stack_ffffffffffffffc0;
    sVar1 = size(in_RSI);
    in_RDI->m_capacity = sVar1;
  }
  for (local_30 = in_RSI->m_begin; local_30 != in_RSI->m_end; local_30 = local_30 + 1) {
    get_alloc(in_RDI);
    std::allocator_traits<std::allocator<long>>::construct<long,long&>
              (in_stack_ffffffffffffffc0,(long *)in_stack_ffffffffffffffb8,(long *)0x12c607);
    in_RDI->m_end = in_RDI->m_end + 1;
  }
  return;
}

Assistant:

small_vector(const small_vector& v, const Alloc& alloc)
        : m_alloc(alloc)
        , m_dynamic_capacity(0)
        , m_dynamic_data(nullptr)
    {
        if (v.size() > StaticCapacity)
        {
            m_dynamic_capacity = v.size();
            m_begin = m_end = m_dynamic_data = atraits::allocate(get_alloc(), m_dynamic_capacity);
            m_capacity = v.size();
        }
        else
        {
            m_begin = m_end = static_begin_ptr();
            m_capacity = StaticCapacity;
        }

        for (auto p = v.m_begin; p != v.m_end; ++p)
        {
            atraits::construct(get_alloc(), m_end, *p);
            ++m_end;
        }
    }